

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

void __thiscall
Units_isBaseUnitsImportModelUnresolved_Test::TestBody
          (Units_isBaseUnitsImportModelUnresolved_Test *this)

{
  element_type *peVar1;
  byte bVar2;
  char *pcVar3;
  void *local_88;
  Message local_80 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  UnitsPtr u2;
  ImportSourcePtr import;
  UnitsPtr u1;
  
  libcellml::Units::create();
  libcellml::Units::create();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"u1",(allocator<char> *)&import);
  libcellml::NamedEntity::setName
            ((string *)u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__cxx11::string::~string((string *)&gtest_ar);
  peVar1 = u2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"some_u",(allocator<char> *)&import);
  libcellml::NamedEntity::setName((string *)peVar1);
  std::__cxx11::string::~string((string *)&gtest_ar);
  libcellml::ImportSource::create();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"I_am_a_url",(allocator<char> *)&gtest_ar_);
  libcellml::ImportSource::setUrl
            ((string *)
             import.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__cxx11::string::~string((string *)&gtest_ar);
  libcellml::ImportedEntity::setImportSource
            ((shared_ptr *)
             (u2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0x10));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"u1",(allocator<char> *)&gtest_ar_);
  libcellml::ImportedEntity::setImportReference
            ((string *)
             (u2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0x10));
  std::__cxx11::string::~string((string *)&gtest_ar);
  gtest_ar_.success_ = (bool)libcellml::ImportedEntity::isImport();
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (gtest_ar_.success_ == false) {
    testing::Message::Message(local_80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&gtest_ar,&gtest_ar_.success_,"u2->isImport()","false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x8c4,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_88,local_80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_80);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  libcellml::ImportedEntity::importSource();
  libcellml::ImportSource::model();
  local_88 = (void *)0x0;
  testing::internal::CmpHelperEQ<std::shared_ptr<libcellml::Model>,decltype(nullptr)>
            ((internal *)&gtest_ar,"u2->importSource()->model()","nullptr",
             (shared_ptr<libcellml::Model> *)&gtest_ar_,&local_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&gtest_ar_.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x8c5,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_80,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  bVar2 = libcellml::Units::isBaseUnit();
  gtest_ar_.success_ = (bool)(bVar2 ^ 1);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (bVar2 != 0) {
    testing::Message::Message(local_80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&gtest_ar,&gtest_ar_.success_,"u2->isBaseUnit()","true");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x8c6,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_88,local_80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_80);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&import.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&u2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Units, isBaseUnitsImportModelUnresolved)
{
    libcellml::UnitsPtr u1 = libcellml::Units::create();
    libcellml::UnitsPtr u2 = libcellml::Units::create();

    u1->setName("u1");
    u2->setName("some_u");

    libcellml::ImportSourcePtr import = libcellml::ImportSource::create();
    import->setUrl("I_am_a_url");

    u2->setImportSource(import);
    u2->setImportReference("u1");

    EXPECT_TRUE(u2->isImport());
    EXPECT_EQ(u2->importSource()->model(), nullptr);
    EXPECT_FALSE(u2->isBaseUnit());
}